

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

void AlphaApplyFilter(ALPHDecoder *alph_dec,int first_row,int last_row,uint8_t *out,int stride)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  
  if (alph_dec->filter_ != WEBP_FILTER_NONE) {
    puVar2 = alph_dec->prev_line_;
    for (; puVar1 = out, first_row < last_row; first_row = first_row + 1) {
      (*WebPUnfilters[alph_dec->filter_])(puVar2,puVar1,puVar1,stride);
      out = puVar1 + stride;
      puVar2 = puVar1;
    }
    alph_dec->prev_line_ = puVar2;
  }
  return;
}

Assistant:

static void AlphaApplyFilter(ALPHDecoder* const alph_dec,
                             int first_row, int last_row,
                             uint8_t* out, int stride) {
  if (alph_dec->filter_ != WEBP_FILTER_NONE) {
    int y;
    const uint8_t* prev_line = alph_dec->prev_line_;
    assert(WebPUnfilters[alph_dec->filter_] != NULL);
    for (y = first_row; y < last_row; ++y) {
      WebPUnfilters[alph_dec->filter_](prev_line, out, out, stride);
      prev_line = out;
      out += stride;
    }
    alph_dec->prev_line_ = prev_line;
  }
}